

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool absl::lts_20250127::PrepareAppendRegion
               (Nonnull<CordRep_*> root,Nonnull<absl::Nullable<char_*>_*> region,
               Nonnull<size_t_*> size,size_t max_length)

{
  bool bVar1;
  CordRepBtree *this;
  pointer pcVar2;
  size_type sVar3;
  CordRepFlat *pCVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  unsigned_long local_68;
  unsigned_long local_60;
  size_t size_increase;
  size_t capacity;
  size_t in_use;
  CordRep *dst;
  Span<char> span;
  size_t max_length_local;
  Nonnull<size_t_*> size_local;
  Nonnull<absl::Nullable<char_*>_*> region_local;
  Nonnull<CordRep_*> root_local;
  
  span.len_ = max_length;
  bVar1 = cord_internal::CordRep::IsBtree(root);
  if ((bVar1) && (bVar1 = cord_internal::RefcountAndFlags::IsOne(&root->refcount), bVar1)) {
    this = cord_internal::CordRep::btree(root);
    _dst = cord_internal::CordRepBtree::GetAppendBuffer(this,span.len_);
    bVar1 = Span<char>::empty((Span<char> *)&dst);
    if (!bVar1) {
      pcVar2 = Span<char>::data((Span<char> *)&dst);
      *region = pcVar2;
      sVar3 = Span<char>::size((Span<char> *)&dst);
      *size = sVar3;
      return true;
    }
  }
  in_use = (size_t)root;
  bVar1 = cord_internal::CordRep::IsFlat(root);
  if ((bVar1) &&
     (bVar1 = cord_internal::RefcountAndFlags::IsOne((RefcountAndFlags *)(in_use + 8)), bVar1)) {
    capacity = *(size_t *)in_use;
    pCVar4 = cord_internal::CordRep::flat((CordRep *)in_use);
    size_increase = cord_internal::CordRepFlat::Capacity(pCVar4);
    if (capacity == size_increase) {
      *region = (char *)0x0;
      *size = 0;
      root_local._7_1_ = false;
    }
    else {
      local_68 = size_increase - capacity;
      puVar5 = std::min<unsigned_long>(&local_68,&span.len_);
      local_60 = *puVar5;
      *(unsigned_long *)in_use = local_60 + *(long *)in_use;
      pCVar4 = cord_internal::CordRep::flat((CordRep *)in_use);
      pcVar6 = cord_internal::CordRepFlat::Data(pCVar4);
      *region = pcVar6 + capacity;
      *size = local_60;
      root_local._7_1_ = true;
    }
  }
  else {
    *region = (char *)0x0;
    *size = 0;
    root_local._7_1_ = false;
  }
  return root_local._7_1_;
}

Assistant:

static inline bool PrepareAppendRegion(
    absl::Nonnull<CordRep*> root, absl::Nonnull<absl::Nullable<char*>*> region,
    absl::Nonnull<size_t*> size, size_t max_length) {
  if (root->IsBtree() && root->refcount.IsOne()) {
    Span<char> span = root->btree()->GetAppendBuffer(max_length);
    if (!span.empty()) {
      *region = span.data();
      *size = span.size();
      return true;
    }
  }

  CordRep* dst = root;
  if (!dst->IsFlat() || !dst->refcount.IsOne()) {
    *region = nullptr;
    *size = 0;
    return false;
  }

  const size_t in_use = dst->length;
  const size_t capacity = dst->flat()->Capacity();
  if (in_use == capacity) {
    *region = nullptr;
    *size = 0;
    return false;
  }

  const size_t size_increase = std::min(capacity - in_use, max_length);
  dst->length += size_increase;

  *region = dst->flat()->Data() + in_use;
  *size = size_increase;
  return true;
}